

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::EndTestCase
          (JunitReporter *this,TestCaseInfo *param_1,Totals *param_2,string *stdOut,string *stdErr)

{
  ulong uVar1;
  ostream *poVar2;
  string *stdErr_local;
  string *stdOut_local;
  Totals *param_2_local;
  TestCaseInfo *param_1_local;
  JunitReporter *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&this->m_stdOut,(string *)stdOut);
    std::operator<<(poVar2,"\n");
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&this->m_stdErr,(string *)stdErr);
    std::operator<<(poVar2,"\n");
  }
  return;
}

Assistant:

virtual void EndTestCase( const Catch::TestCaseInfo&, const Totals&, const std::string& stdOut, const std::string& stdErr ) {
            if( !stdOut.empty() )
                m_stdOut << stdOut << "\n";
            if( !stdErr.empty() )
                m_stdErr << stdErr << "\n";
        }